

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O3

ExtensionalityClauseIterator __thiscall
Saturation::ExtensionalityClauseContainer::activeIterator
          (ExtensionalityClauseContainer *this,TermList sort)

{
  Entry *pEVar1;
  undefined8 *puVar2;
  uint64_t in_RDX;
  TermList local_28;
  TermList local_20;
  
  local_28._content = in_RDX;
  pEVar1 = Lib::
           DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry((DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)sort._content,&local_28);
  if (pEVar1 == (Entry *)0x0) {
    Lib::VirtualIterator<Saturation::ExtensionalityClause>::getEmpty();
  }
  else {
    local_20._content = local_28._content;
    pEVar1 = Lib::
             DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry((DHMap<Kernel::TermList,_Lib::List<Saturation::ExtensionalityClause>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)sort._content,&local_20);
    puVar2 = (undefined8 *)::operator_new(0x50,8);
    puVar2[2] = sort._content;
    puVar2[3] = &pEVar1->_val;
    puVar2[4] = 0;
    puVar2[5] = 0;
    *puVar2 = &PTR__ProxyIterator_00b3f070;
    *(undefined1 *)(puVar2 + 6) = 0;
    *(undefined8 **)&this->_clausesBySort = puVar2;
    *(undefined4 *)(puVar2 + 1) = 1;
  }
  return (ExtensionalityClauseIterator)(IteratorCore<Saturation::ExtensionalityClause> *)this;
}

Assistant:

ExtensionalityClauseIterator ExtensionalityClauseContainer::activeIterator(TermList sort) {
  if(_clausesBySort.find(sort)){
    return pvi(getFilteredDelIterator(
               ExtensionalityClauseList::DelIterator(_clausesBySort.get(sort)),
               ActiveFilterFn(*this)));
  } else {
    return ExtensionalityClauseIterator::getEmpty();
  }
}